

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# database.hpp
# Opt level: O0

shared_ptr<void> __thiscall pstore::database::getrw(database *this,address addr,size_t size)

{
  undefined8 in_RCX;
  __shared_count<(__gnu_cxx::_Lock_policy)2> extraout_RDX;
  shared_ptr<void> sVar1;
  shared_ptr<const_void> local_38;
  size_t size_local;
  database *this_local;
  address addr_local;
  
  size_local = addr.a_;
  this_local = (database *)size;
  addr_local.a_ = (value_type)this;
  (**(code **)(*(long *)addr.a_ + 0x10))(&local_38,addr.a_,size,in_RCX,1);
  std::const_pointer_cast<void,void_const>((shared_ptr<const_void> *)this);
  std::shared_ptr<const_void>::~shared_ptr(&local_38);
  sVar1.super___shared_ptr<void,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi = extraout_RDX._M_pi;
  sVar1.super___shared_ptr<void,_(__gnu_cxx::_Lock_policy)2>._M_ptr = this;
  return (shared_ptr<void>)sVar1.super___shared_ptr<void,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

std::shared_ptr<void> getrw (address const addr, std::size_t const size) {
            return std::const_pointer_cast<void> (
                this->get (addr, size, true /*initialized*/, true /*writable*/));
        }